

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filter.cpp
# Opt level: O0

float __thiscall nv::LanczosFilter::evaluate(LanczosFilter *this,float x)

{
  float fVar1;
  float fVar2;
  double dVar3;
  float x_local;
  LanczosFilter *this_local;
  
  dVar3 = std::fabs((double)(ulong)(uint)x);
  fVar2 = SUB84(dVar3,0);
  if (3.0 <= fVar2) {
    this_local._4_4_ = 0.0;
  }
  else {
    fVar1 = anon_unknown.dwarf_469c36::sincf(fVar2 * 3.1415927);
    fVar2 = anon_unknown.dwarf_469c36::sincf((fVar2 * 3.1415927) / 3.0);
    this_local._4_4_ = fVar1 * fVar2;
  }
  return this_local._4_4_;
}

Assistant:

float LanczosFilter::evaluate(float x) const
{
	x = fabs(x);
	if( x < 3.0f ) return sincf(PI * x) * sincf(PI * x / 3.0f);
	return 0.0f;
}